

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lemon.c
# Opt level: O1

void lemon_addtext(char *zBuf,int *pnUsed,char *zIn,int nIn,int iWidth)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  uint uVar4;
  int iVar5;
  
  if (nIn < 0) {
    nIn = 0xffffffff;
    pcVar3 = zIn;
    do {
      nIn = nIn + 1;
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar1 != '\0');
  }
  uVar4 = iWidth;
  if (nIn < iWidth) {
    do {
      iVar5 = *pnUsed;
      *pnUsed = iVar5 + 1;
      zBuf[iVar5] = ' ';
      iWidth = iWidth + -1;
      uVar4 = nIn;
    } while (nIn < iWidth);
  }
  if (nIn != 0) {
    memcpy(zBuf + *pnUsed,zIn,(ulong)(uint)nIn);
    *pnUsed = *pnUsed + nIn;
    for (iVar5 = -uVar4; nIn < iVar5; iVar5 = iVar5 + -1) {
      iVar2 = *pnUsed;
      *pnUsed = iVar2 + 1;
      zBuf[iVar2] = ' ';
    }
    zBuf[*pnUsed] = '\0';
  }
  return;
}

Assistant:

static void lemon_addtext(
  char *zBuf,           /* The buffer to which text is added */
  int *pnUsed,          /* Slots of the buffer used so far */
  const char *zIn,      /* Text to add */
  int nIn,              /* Bytes of text to add.  -1 to use strlen() */
  int iWidth            /* Field width.  Negative to left justify */
){
  if( nIn<0 ) for(nIn=0; zIn[nIn]; nIn++){}
  while( iWidth>nIn ){ zBuf[(*pnUsed)++] = ' '; iWidth--; }
  if( nIn==0 ) return;
  memcpy(&zBuf[*pnUsed], zIn, nIn);
  *pnUsed += nIn;
  while( (-iWidth)>nIn ){ zBuf[(*pnUsed)++] = ' '; iWidth++; }
  zBuf[*pnUsed] = 0;
}